

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

char * cmGetDefinition(void *arg,char *def)

{
  cmValue cVar1;
  pointer pcVar2;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,def,&local_31);
  cVar1 = cmMakefile::GetDefinition((cmMakefile *)arg,&local_30);
  if (cVar1.Value == (string *)0x0) {
    pcVar2 = (pointer)0x0;
  }
  else {
    pcVar2 = ((cVar1.Value)->_M_dataplus)._M_p;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar2;
}

Assistant:

static const char* CCONV cmGetDefinition(void* arg, const char* def)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  return mf->GetDefinition(def).GetCStr();
}